

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O2

void __thiscall sjtu::UserManager::modify_profile(UserManager *this,int argc,string *argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar4;
  UserManager *this_00;
  bool bVar5;
  __type _Var6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  pair<long,_bool> pVar12;
  int local_144;
  hashType local_140;
  char local_138;
  UserManager *local_130;
  long local_128;
  char local_120;
  string curname;
  string umail;
  string uname;
  string uspass;
  string usname;
  string local_78;
  hashType local_58;
  string local_50;
  undefined4 extraout_var_00;
  
  usname._M_dataplus._M_p = (pointer)&usname.field_2;
  usname._M_string_length = 0;
  usname.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&uspass,"",(allocator *)&uname);
  std::__cxx11::string::string((string *)&uname,"",(allocator *)&umail);
  local_130 = this;
  std::__cxx11::string::string((string *)&umail,"",(allocator *)&curname);
  curname._M_dataplus._M_p = (pointer)&curname.field_2;
  curname._M_string_length = 0;
  curname.field_2._M_local_buf[0] = '\0';
  local_144 = -1;
  for (lVar11 = 0; this_00 = local_130, lVar11 < argc; lVar11 = lVar11 + 2) {
    bVar5 = std::operator==(argv,"-u");
    psVar10 = &usname;
    if (bVar5) {
LAB_00104733:
      std::__cxx11::string::_M_assign((string *)psVar10);
    }
    else {
      bVar5 = std::operator==(argv,"-p");
      psVar10 = &uspass;
      if (bVar5) goto LAB_00104733;
      bVar5 = std::operator==(argv,"-n");
      psVar10 = &uname;
      if (bVar5) goto LAB_00104733;
      bVar5 = std::operator==(argv,"-m");
      psVar10 = &umail;
      if (bVar5) goto LAB_00104733;
      bVar5 = std::operator==(argv,"-c");
      psVar10 = &curname;
      if (bVar5) goto LAB_00104733;
      bVar5 = std::operator==(argv,"-g");
      if (bVar5) {
        local_144 = std::__cxx11::stoi(argv + 1,(size_t *)0x0,10);
      }
    }
    argv = argv + 2;
  }
  pBVar4 = local_130->UserBpTree;
  std::__cxx11::string::string((string *)&local_50,(string *)&curname);
  local_140 = StringHasher::operator()((StringHasher *)this_00,&local_50);
  pVar12 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar4,&local_140);
  local_128 = pVar12.first;
  local_120 = pVar12.second;
  std::__cxx11::string::~string((string *)&local_50);
  pBVar4 = this_00->UserBpTree;
  std::__cxx11::string::string((string *)&local_78,(string *)&usname);
  local_58 = StringHasher::operator()((StringHasher *)this_00,&local_78);
  pVar12 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar4,&local_58);
  local_140 = pVar12.first;
  local_138 = pVar12.second;
  std::__cxx11::string::~string((string *)&local_78);
  if ((local_120 != '\x01') || (local_138 != '\x01')) {
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::endl<char,std::char_traits<char>>(poVar9);
    goto LAB_001049ab;
  }
  iVar7 = (*(this_00->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (this_00->UserFile,&local_128);
  iVar1 = *(int *)(CONCAT44(extraout_var,iVar7) + 0x68);
  uVar2 = *(uint *)(CONCAT44(extraout_var,iVar7) + 0x6c);
  uVar3 = this_00->online_flag;
  iVar7 = (*(this_00->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (this_00->UserFile,&local_140);
  pcVar8 = (char *)CONCAT44(extraout_var_00,iVar7);
  if (*(int *)(pcVar8 + 0x68) < iVar1) {
LAB_001048a2:
    iVar7 = -1;
    poVar9 = (ostream *)&std::cout;
    if ((uVar2 == uVar3) && (local_144 < iVar1)) {
      bVar5 = std::operator!=(&uspass,"");
      if (bVar5) {
        strcpy(pcVar8 + 0x15,uspass._M_dataplus._M_p);
      }
      bVar5 = std::operator!=(&uname,"");
      if (bVar5) {
        strcpy(pcVar8 + 0x34,uname._M_dataplus._M_p);
      }
      bVar5 = std::operator!=(&umail,"");
      if (bVar5) {
        strcpy(pcVar8 + 0x49,umail._M_dataplus._M_p);
      }
      if (local_144 != -1) {
        *(int *)(pcVar8 + 0x68) = local_144;
      }
      (*(this_00->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
                (this_00->UserFile,pcVar8 + 0x78);
      poVar9 = std::operator<<((ostream *)&std::cout,pcVar8);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8 + 0x34);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8 + 0x49);
      poVar9 = std::operator<<(poVar9," ");
      iVar7 = *(int *)(pcVar8 + 0x68);
    }
  }
  else {
    _Var6 = std::operator==(&curname,&usname);
    iVar7 = -1;
    poVar9 = (ostream *)&std::cout;
    if (_Var6) goto LAB_001048a2;
  }
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar7);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_001049ab:
  std::__cxx11::string::~string((string *)&curname);
  std::__cxx11::string::~string((string *)&umail);
  std::__cxx11::string::~string((string *)&uname);
  std::__cxx11::string::~string((string *)&uspass);
  std::__cxx11::string::~string((string *)&usname);
  return;
}

Assistant:

void modify_profile(int argc, std::string *argv) {
            std::string usname, uspass = "", uname = "", umail = "", curname;
            int upri = -1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
                else if (argv[i] == "-n") uname = argv[i + 1];
                else if (argv[i] == "-m") umail = argv[i + 1];
                else if (argv[i] == "-c") curname = argv[i + 1];
                else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
            }
            std::pair<locType, bool> tmp1 = UserBpTree->find(hasher(curname));
            std::pair<locType, bool> tmp2 = UserBpTree->find(hasher(usname));
            if (tmp1.second == true && tmp2.second == true) {
                userType *cur = UserFile->read(tmp1.first);
                int cur_privilege = cur->privilege;
                bool cur_is_online = cur->is_online == online_flag;
                userType *user = UserFile->read(tmp2.first);
                if ((cur_privilege > user->privilege || curname == usname) && cur_is_online == true &&
                    cur_privilege > upri) {
                    if (uspass != "") strcpy(user->password, uspass.c_str());
                    if (uname != "") strcpy(user->name, uname.c_str());;
                    if (umail != "") strcpy(user->mailAddr, umail.c_str());;
                    if (upri != -1) user->privilege = upri;
                    UserFile->save(user->offset);
                    std::cout << user->username << " " << user->name << " " << user->mailAddr << " " << user->privilege
                              << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }